

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O0

char * getDynamicModelName(dynModel model)

{
  char *pcStack_10;
  dynModel model_local;
  
  switch(model) {
  case Portable:
    pcStack_10 = "Portable";
    break;
  default:
    pcStack_10 = "unknown";
    break;
  case Stationary:
    pcStack_10 = "Stationary";
    break;
  case Pedestrian:
    pcStack_10 = "Pedestrian";
    break;
  case Automotive:
    pcStack_10 = "Automotive";
    break;
  case Sea:
    pcStack_10 = "Sea";
    break;
  case Air1G:
    pcStack_10 = "Air (less than 1G acceleration)";
    break;
  case Air2G:
    pcStack_10 = "Air (less than 2G acceleration)";
    break;
  case Air4G:
    pcStack_10 = "Air (less than 4G acceleration)";
    break;
  case Watch:
    pcStack_10 = "Watch";
  }
  return pcStack_10;
}

Assistant:

extern char* getDynamicModelName(dynModel model) {
    switch (model) {
        case Portable:   return "Portable";
        case Stationary: return "Stationary";
        case Pedestrian: return "Pedestrian";
        case Automotive: return "Automotive";
        case Sea:        return "Sea";
        case Air1G:      return "Air (less than 1G acceleration)";
        case Air2G:      return "Air (less than 2G acceleration)";
        case Air4G:      return "Air (less than 4G acceleration)";
        case Watch:      return "Watch";
        default:         return "unknown";
    }
}